

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O0

void common_ngram_cache_draft
               (vector<int,_std::allocator<int>_> *inp,vector<int,_std::allocator<int>_> *draft,
               int n_draft,int ngram_min,int ngram_max,common_ngram_cache *nc_context,
               common_ngram_cache *nc_dynamic,common_ngram_cache *nc_static)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  llama_token lVar4;
  size_type sVar5;
  vector<int,_std::allocator<int>_> *draft_00;
  _Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
  min_percent;
  int in_ECX;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int in_R8D;
  int j_1;
  common_ngram ngram_cd;
  int ngram_start_cd;
  int ngram_size_cd;
  vector<common_ngram,_std::allocator<common_ngram>_> ngrams_cd;
  common_ngram_cache_part part_static;
  iterator part_static_it;
  int j;
  common_ngram ngram_static;
  int ngram_start_static;
  llama_token drafted_token;
  int inp_size;
  common_log *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  uint in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  llama_token in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar6;
  int local_d4;
  common_ngram local_d0;
  int local_c0;
  int local_bc;
  _Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
  local_90;
  common_ngram_cache *in_stack_ffffffffffffff78;
  common_ngram in_stack_ffffffffffffff84;
  llama_token in_stack_ffffffffffffffbc;
  llama_token in_stack_ffffffffffffffc0;
  llama_token in_stack_ffffffffffffffc4;
  llama_token in_stack_ffffffffffffffc8;
  uint uVar7;
  
  sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  if (sVar5 != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
               ,0x96,"GGML_ASSERT(%s) failed","draft.size() == 1");
  }
  sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
  iVar2 = (int)sVar5;
  if (1 < iVar2) {
    while (sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RSI), (int)sVar5 + -1 < in_EDX) {
      uVar7 = 0xffffffff;
      draft_00 = (vector<int,_std::allocator<int>_> *)(long)(iVar2 + -2);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
      iVar3 = (int)draft_00 + (int)sVar5 + -1;
      common_ngram::common_ngram((common_ngram *)&stack0xffffffffffffffbc);
      iVar6 = iVar3;
      for (; iVar3 < iVar6 + 2; iVar3 = iVar3 + 1) {
        lVar4 = get_token((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),draft_00,
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        *(llama_token *)(&stack0xffffffffffffffbc + (long)(iVar3 - iVar6) * 4) = lVar4;
      }
      min_percent._M_cur =
           (__node_type *)
           std::
           unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
           ::find((unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   *)in_stack_fffffffffffffee8,(key_type *)0x362608);
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)0x36261d);
      local_90._M_cur =
           (__node_type *)
           std::
           unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
           ::end((unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                  *)in_stack_fffffffffffffee8);
      bVar1 = std::__detail::operator!=
                        ((_Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                          *)&stack0xffffffffffffffb0,&local_90);
      if (bVar1) {
        std::__detail::
        _Node_iterator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_false,_true>
                      *)0x36265a);
        std::
        unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::operator=((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)in_stack_fffffffffffffee8);
      }
      std::vector<common_ngram,_std::allocator<common_ngram>_>::vector
                ((vector<common_ngram,_std::allocator<common_ngram>_> *)0x362692);
      for (local_bc = in_ECX; local_bc <= in_R8D; local_bc = local_bc + 1) {
        in_stack_ffffffffffffff04 = iVar2 - local_bc;
        sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
        local_c0 = in_stack_ffffffffffffff04 + -1 + (int)sVar5;
        common_ngram::common_ngram(&local_d0);
        for (local_d4 = local_c0; local_d4 < local_c0 + local_bc; local_d4 = local_d4 + 1) {
          in_stack_ffffffffffffff00 =
               get_token((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),draft_00,
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
          local_d0.tokens[local_d4 - local_c0] = in_stack_ffffffffffffff00;
        }
        std::vector<common_ngram,_std::allocator<common_ngram>_>::push_back
                  ((vector<common_ngram,_std::allocator<common_ngram>_> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (value_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      }
      if (uVar7 == 0xffffffff) {
        in_stack_fffffffffffffefc =
             try_draft((common_ngram_cache *)CONCAT44(iVar2,0xffffffff),
                       (vector<common_ngram,_std::allocator<common_ngram>_> *)
                       CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                       (common_ngram_cache_part *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int *)CONCAT44(in_stack_ffffffffffffffbc,iVar3),(int *)min_percent._M_cur);
        uVar7 = in_stack_fffffffffffffefc;
      }
      if (uVar7 == 0xffffffff) {
        in_stack_fffffffffffffef8 =
             try_draft((common_ngram_cache *)CONCAT44(iVar2,0xffffffff),
                       (vector<common_ngram,_std::allocator<common_ngram>_> *)
                       CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                       (common_ngram_cache_part *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int *)CONCAT44(in_stack_ffffffffffffffbc,iVar3),(int *)min_percent._M_cur);
        uVar7 = in_stack_fffffffffffffef8;
      }
      if (uVar7 == 0xffffffff) {
        in_stack_fffffffffffffef4 = try_draft(in_stack_ffffffffffffff78,in_stack_ffffffffffffff84);
        uVar7 = in_stack_fffffffffffffef4;
      }
      if (uVar7 == 0xffffffff) {
        iVar6 = 3;
      }
      else {
        if (-1 < common_log_verbosity_thold) {
          in_stack_fffffffffffffee8 = common_log_main();
          common_log_add(in_stack_fffffffffffffee8,GGML_LOG_LEVEL_NONE,
                         " - draft candidate: token=%d\n",(ulong)uVar7);
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (value_type_conflict *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        iVar6 = 0;
      }
      std::vector<common_ngram,_std::allocator<common_ngram>_>::~vector
                ((vector<common_ngram,_std::allocator<common_ngram>_> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)0x3628d1);
      if (iVar6 != 0) {
        return;
      }
      in_stack_ffffffffffffff14 = 0;
    }
  }
  return;
}

Assistant:

void common_ngram_cache_draft(
    std::vector<llama_token> & inp, std::vector<llama_token> & draft, int n_draft, int ngram_min, int ngram_max,
    common_ngram_cache & nc_context, common_ngram_cache & nc_dynamic, common_ngram_cache & nc_static
) {
    GGML_ASSERT(draft.size() == 1);
    const int inp_size = inp.size();

    if (inp_size < LLAMA_NGRAM_STATIC) {
        return;
    }

    while ((int) draft.size()-1 < n_draft) {
        llama_token drafted_token = LLAMA_TOKEN_NULL;

        const int ngram_start_static = inp_size-LLAMA_NGRAM_STATIC + draft.size()-1;
        common_ngram ngram_static;
        for (int j = ngram_start_static; j < ngram_start_static + LLAMA_NGRAM_STATIC; ++j) {
            ngram_static.tokens[j-ngram_start_static] = get_token(inp, draft, j);
        }
        common_ngram_cache::iterator part_static_it = nc_static.find(ngram_static);
        common_ngram_cache_part part_static;
        if (part_static_it != nc_static.end()) {
            part_static = part_static_it->second;
        }

        // cd = context + dynamic
        std::vector<common_ngram> ngrams_cd;
        for (int ngram_size_cd = ngram_min; ngram_size_cd <= ngram_max; ++ngram_size_cd) {
            const int ngram_start_cd = inp_size-ngram_size_cd + draft.size()-1;
            common_ngram ngram_cd;
            for (int j = ngram_start_cd; j < ngram_start_cd + ngram_size_cd; ++j) {
                ngram_cd.tokens[j-ngram_start_cd] = get_token(inp, draft, j);
            }
            ngrams_cd.push_back(ngram_cd);
        }
        if (drafted_token == LLAMA_TOKEN_NULL) {
            drafted_token = try_draft(nc_context, ngrams_cd, part_static, draft_min_sample_size_lax, draft_min_percent_lax);
        }
        if (drafted_token == LLAMA_TOKEN_NULL) {
            drafted_token = try_draft(nc_dynamic, ngrams_cd, part_static, draft_min_sample_size_strict, draft_min_percent_strict);
        }
        if (drafted_token == LLAMA_TOKEN_NULL) {
            drafted_token = try_draft(nc_static, ngram_static);
        }

        if (drafted_token == LLAMA_TOKEN_NULL) {
            break;
        }

        LOG(" - draft candidate: token=%d\n", drafted_token);
        draft.push_back(drafted_token);
    }
}